

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall
fasttext::FastText::test(FastText *this,istream *in,int32_t k,real threshold,Meter *meter)

{
  bool bVar1;
  int32_t iVar2;
  int iVar3;
  element_type *peVar4;
  element_type *this_00;
  Meter *in_RCX;
  undefined4 in_EDX;
  Dictionary *in_RSI;
  undefined8 in_RDI;
  undefined4 in_XMM0_Da;
  double __x;
  State state;
  Predictions predictions;
  vector<int,_std::allocator<int>_> labels;
  vector<int,_std::allocator<int>_> line;
  State *in_stack_ffffffffffffff10;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  int32_t seed;
  int32_t in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff44;
  real in_stack_ffffffffffffff74;
  Predictions *in_stack_ffffffffffffff78;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff80;
  int32_t in_stack_ffffffffffffff8c;
  FastText *in_stack_ffffffffffffff90;
  vector<int,_std::allocator<int>_> local_50;
  minstd_rand in_stack_ffffffffffffffd8;
  
  seed = (int32_t)((ulong)in_RDI >> 0x20);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bfd69);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1bfd76);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x1bfd83);
  peVar4 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1bfd8d);
  iVar3 = peVar4->dim;
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x1bfda5);
  iVar2 = Dictionary::nlabels(this_00);
  Model::State::State((State *)CONCAT44(in_stack_ffffffffffffff44,iVar2),iVar3,
                      in_stack_ffffffffffffff38,seed);
  std::ios::clear((long)&(in_RSI->args_).
                         super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                  (in_RSI->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr[-1].autotuneModelSize.field_2._M_allocated_capacity,0);
  std::istream::seekg((long)in_RSI,_S_beg);
  while (iVar3 = std::istream::peek(), iVar3 != -1) {
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bfe2b);
    in_stack_ffffffffffffff20 = &local_50;
    std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)0x1bfe3d);
    std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x1bfe4b);
    Dictionary::getLine(in_RSI,(istream *)CONCAT44(in_EDX,in_XMM0_Da),
                        (vector<int,_std::allocator<int>_> *)in_RCX,
                        (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd8._M_x);
    bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffff20);
    if ((!bVar1) &&
       (bVar1 = std::vector<int,_std::allocator<int>_>::empty(in_stack_ffffffffffffff20), !bVar1)) {
      in_stack_ffffffffffffff10 = (State *)&stack0xffffffffffffff98;
      std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::clear
                ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)0x1bfea3)
      ;
      predict(in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c,in_stack_ffffffffffffff80,
              in_stack_ffffffffffffff78,in_stack_ffffffffffffff74);
      Meter::log(in_RCX,__x);
    }
  }
  Model::State::~State(in_stack_ffffffffffffff10);
  std::vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_>::~vector
            ((vector<std::pair<float,_int>,_std::allocator<std::pair<float,_int>_>_> *)
             in_stack_ffffffffffffff20);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff20);
  std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff20);
  return;
}

Assistant:

void FastText::test(std::istream& in, int32_t k, real threshold, Meter& meter)
    const {
  std::vector<int32_t> line;
  std::vector<int32_t> labels;
  Predictions predictions;
  Model::State state(args_->dim, dict_->nlabels(), 0);
  in.clear();
  in.seekg(0, std::ios_base::beg);

  while (in.peek() != EOF) {
    line.clear();
    labels.clear();
    dict_->getLine(in, line, labels);

    if (!labels.empty() && !line.empty()) {
      predictions.clear();
      predict(k, line, predictions, threshold);
      meter.log(labels, predictions);
    }
  }
}